

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_import_free(lysf_ctx *ctx,lysp_import *import)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  long lVar3;
  
  lydict_remove(ctx->ctx,import->name);
  lydict_remove(ctx->ctx,import->prefix);
  lydict_remove(ctx->ctx,import->dsc);
  lydict_remove(ctx->ctx,import->ref);
  lVar3 = 0;
  plVar2 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = import->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      return;
    }
    if (plVar1[-1].exts <= plVar2) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar3));
    plVar2 = (lysp_ext_instance *)((long)&plVar2->name + 1);
    lVar3 = lVar3 + 0x70;
  }
  free(&plVar1[-1].exts);
  return;
}

Assistant:

static void
lysp_import_free(struct lysf_ctx *ctx, struct lysp_import *import)
{
    /* imported module is freed directly from the context's list */
    lydict_remove(ctx->ctx, import->name);
    lydict_remove(ctx->ctx, import->prefix);
    lydict_remove(ctx->ctx, import->dsc);
    lydict_remove(ctx->ctx, import->ref);
    FREE_ARRAY(ctx, import->exts, lysp_ext_instance_free);
}